

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  XXH64_state_t *state_in;
  ZSTD_format_e format;
  bool bVar1;
  ZSTD_ErrorCode ZVar2;
  size_t sVar3;
  XXH64_state_t *pXVar4;
  XXH64_hash_t XVar5;
  int iVar6;
  XXH64_state_t *pXVar7;
  XXH64_state_t *__n;
  uint *puVar8;
  undefined1 *puVar9;
  char cVar10;
  byte bVar11;
  undefined1 *puVar12;
  XXH64_state_t *__n_00;
  XXH64_state_t *pXVar13;
  void *local_98;
  void *local_80;
  void *local_50;
  blockProperties_t local_44;
  void *local_38;
  
  local_50 = dict;
  if (ddict != (ZSTD_DDict *)0x0) {
    local_50 = ZSTD_DDict_dictContent(ddict);
    dictSize = ZSTD_DDict_dictSize(ddict);
  }
  state_in = &dctx->xxhState;
  bVar11 = 0;
  pXVar7 = state_in;
  local_80 = dst;
  do {
    pXVar4 = pXVar7;
    do {
      if (srcSize < (undefined1 *)((ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1)) {
        if ((undefined1 *)srcSize != (undefined1 *)0x0) {
          return 0xffffffffffffffb8;
        }
        return (long)local_80 - (long)dst;
      }
      iVar6 = 0;
      pXVar7 = pXVar4;
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        pXVar7 = (XXH64_state_t *)0xffffffffffffffb8;
        if ((undefined1 *)0x7 < srcSize) {
          pXVar7 = (XXH64_state_t *)0xfffffffffffffff2;
          if ((*(uint *)((long)src + 4) >> 3 < 0x1fffffff) &&
             (pXVar7 = (XXH64_state_t *)((ulong)*(uint *)((long)src + 4) + 8), srcSize < pXVar7)) {
            pXVar7 = (XXH64_state_t *)0xffffffffffffffb8;
          }
        }
        iVar6 = 1;
        if (pXVar7 < (XXH64_state_t *)0xffffffffffffff89) {
          src = (void *)((long)src + (long)pXVar7);
          srcSize = srcSize + -(long)pXVar7;
          iVar6 = 2;
          pXVar7 = pXVar4;
        }
      }
      pXVar4 = pXVar7;
    } while (iVar6 == 2);
    if (iVar6 != 0) {
      return (size_t)pXVar7;
    }
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar3 = ZSTD_decompressBegin_usingDict(dctx,local_50,dictSize);
      if (0xffffffffffffff88 < sVar3) {
        return sVar3;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    ZSTD_checkContinuity(dctx,local_80,dstCapacity);
    format = dctx->format;
    local_38 = dst;
    if (srcSize < (undefined1 *)((ulong)(format == ZSTD_f_zstd1) * 4 + 5)) {
      __n_00 = (XXH64_state_t *)0xffffffffffffffb8;
    }
    else {
      pXVar4 = (XXH64_state_t *)
               ZSTD_frameHeaderSize_internal(src,(ulong)(format == ZSTD_f_zstd1) * 4 + 1,format);
      puVar8 = (uint *)src;
      puVar9 = (undefined1 *)srcSize;
      if (pXVar4 < (XXH64_state_t *)0xffffffffffffff89) {
        if (srcSize < (undefined1 *)((long)&pXVar4->total_len + 3U)) {
          __n_00 = (XXH64_state_t *)0xffffffffffffffb8;
        }
        else {
          __n_00 = (XXH64_state_t *)ZSTD_decodeFrameHeader(dctx,src,(size_t)pXVar4);
          if (__n_00 < (XXH64_state_t *)0xffffffffffffff89) {
            puVar8 = (uint *)((long)src + (long)(pXVar4->mem64 + -5));
            puVar9 = (undefined1 *)(srcSize + -(long)pXVar4);
            bVar1 = true;
            goto LAB_0071d7b1;
          }
        }
        bVar1 = false;
      }
      else {
        bVar1 = false;
        __n_00 = pXVar4;
      }
LAB_0071d7b1:
      if (bVar1) {
        local_98 = local_80;
        pXVar4 = __n_00;
        do {
          __n_00 = (XXH64_state_t *)ZSTD_getcBlockSize(puVar8,(size_t)puVar9,&local_44);
          cVar10 = '\x01';
          if (__n_00 < (XXH64_state_t *)0xffffffffffffff89) {
            puVar8 = (uint *)((long)puVar8 + 3);
            puVar12 = puVar9 + -3;
            puVar9 = puVar12 + -(long)__n_00;
            if (puVar12 < __n_00) {
              pXVar13 = (XXH64_state_t *)0xffffffffffffffb8;
            }
            else {
              if (local_44.blockType == bt_raw) {
                pXVar13 = (XXH64_state_t *)0xffffffffffffffba;
                if (__n_00 <= (undefined1 *)((long)local_80 + (dstCapacity - (long)local_98))) {
                  if (local_98 == (void *)0x0) {
                    pXVar13 = (XXH64_state_t *)0xffffffffffffffb6;
                    if (__n_00 == (XXH64_state_t *)0x0) {
                      pXVar13 = __n_00;
                    }
                  }
                  else {
                    memcpy(local_98,puVar8,(size_t)__n_00);
                    pXVar13 = __n_00;
                  }
                }
              }
              else if (local_44.blockType == bt_rle) {
                __n = (XXH64_state_t *)(ulong)local_44.origSize;
                pXVar13 = (XXH64_state_t *)0xffffffffffffffba;
                if (__n <= (undefined1 *)((long)local_80 + (dstCapacity - (long)local_98))) {
                  pXVar13 = __n;
                  if (local_98 == (void *)0x0) {
                    if (__n != (XXH64_state_t *)0x0) {
                      pXVar13 = (XXH64_state_t *)0xffffffffffffffb6;
                    }
                  }
                  else {
                    memset(local_98,(uint)*(byte *)puVar8,(size_t)__n);
                  }
                }
              }
              else {
                if (local_44.blockType != bt_compressed) {
                  pXVar13 = (XXH64_state_t *)0xffffffffffffffec;
                  goto LAB_0071d96a;
                }
                pXVar13 = (XXH64_state_t *)
                          ZSTD_decompressBlock_internal
                                    (dctx,local_98,(long)local_80 + (dstCapacity - (long)local_98),
                                     puVar8,(size_t)__n_00,1);
              }
              if (pXVar13 < (XXH64_state_t *)0xffffffffffffff89) {
                if (dctx->validateChecksum != 0) {
                  XXH64_update(state_in,local_98,(size_t)pXVar13);
                }
                local_98 = (void *)((long)local_98 + (long)pXVar13);
                puVar8 = (uint *)((long)puVar8 + (long)__n_00);
                cVar10 = (local_44.lastBlock != 0) * '\x05';
                __n_00 = pXVar4;
                goto LAB_0071d96e;
              }
            }
LAB_0071d96a:
            cVar10 = '\x01';
            puVar9 = puVar12;
            __n_00 = pXVar13;
          }
LAB_0071d96e:
          pXVar4 = __n_00;
        } while (cVar10 == '\0');
        if (cVar10 == '\x05') {
          puVar12 = (undefined1 *)(dctx->fParams).frameContentSize;
          __n_00 = (XXH64_state_t *)((long)local_98 - (long)local_80);
          if ((puVar12 == (undefined1 *)0xffffffffffffffff) || (__n_00 == (XXH64_state_t *)puVar12))
          {
            if ((dctx->fParams).checksumFlag == 0) {
LAB_0071da94:
              srcSize = (size_t)puVar9;
              ZSTD_DCtx_trace_end(dctx,(U64)__n_00,(long)puVar8 - (long)src,0);
              src = puVar8;
            }
            else if (puVar9 < (undefined1 *)0x4) {
              __n_00 = (XXH64_state_t *)0xffffffffffffffea;
            }
            else {
              if ((dctx->forceIgnoreChecksum != ZSTD_d_validateChecksum) ||
                 (XVar5 = XXH64_digest(state_in), *puVar8 == (uint)XVar5)) {
                puVar8 = puVar8 + 1;
                puVar9 = puVar9 + -4;
                goto LAB_0071da94;
              }
              __n_00 = (XXH64_state_t *)0xffffffffffffffea;
            }
          }
          else {
            __n_00 = (XXH64_state_t *)0xffffffffffffffec;
          }
        }
      }
    }
    ZVar2 = ZSTD_getErrorCode((size_t)__n_00);
    if ((bool)(bVar11 & ZVar2 == ZSTD_error_prefix_unknown)) {
      __n_00 = (XXH64_state_t *)0xffffffffffffffb8;
LAB_0071da11:
      bVar1 = false;
      pXVar7 = __n_00;
    }
    else {
      if ((XXH64_state_t *)0xffffffffffffff88 < __n_00) goto LAB_0071da11;
      local_80 = (void *)((long)local_80 + (long)__n_00);
      dstCapacity = dstCapacity - (long)__n_00;
      bVar1 = true;
    }
    bVar11 = 1;
    dst = local_38;
    if (!bVar1) {
      return (size_t)pXVar7;
    }
  } while( true );
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <= dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (unsigned)magicNumber, ZSTD_MAGICNUMBER);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize, "readSkippableFrameSize failed");
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict), "");
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize), "");
        }
        ZSTD_checkContinuity(dctx, dst, dstCapacity);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "At least one frame successfully completed, "
                "but following bytes are garbage: "
                "it's more likely to be a srcSize error, "
                "specifying more input bytes than size of frame(s). "
                "Note: one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic bytes. "
                "But this is _much_ less likely than a srcSize field error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (size_t)((BYTE*)dst - (BYTE*)dststart);
}